

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

__pid_t __thiscall efsw::Thread::wait(Thread *this,void *__stat_loc)

{
  ThreadImpl *this_00;
  __pid_t in_EAX;
  __pid_t extraout_EAX;
  
  if (this->mThreadImpl != (ThreadImpl *)0x0) {
    in_EAX = Platform::ThreadImpl::wait(this->mThreadImpl,__stat_loc);
    this_00 = this->mThreadImpl;
    if (this_00 != (ThreadImpl *)0x0) {
      Platform::ThreadImpl::~ThreadImpl(this_00);
      operator_delete(this_00);
      this->mThreadImpl = (ThreadImpl *)0x0;
      in_EAX = extraout_EAX;
    }
  }
  return in_EAX;
}

Assistant:

void Thread::wait() {
	if ( mThreadImpl ) {
		mThreadImpl->wait();

		efSAFE_DELETE( mThreadImpl );
	}
}